

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpFormat.h
# Opt level: O1

void __thiscall brynet::net::HttpResponse::setBody(HttpResponse *this,string *body)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  char cVar5;
  string __str;
  long *local_60;
  uint local_58;
  long local_50 [2];
  key_type local_40;
  
  std::__cxx11::string::_M_assign((string *)&this->mBody);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Content-Length","");
  __val = body->_M_string_length;
  cVar5 = '\x01';
  if (9 < __val) {
    uVar4 = __val;
    cVar2 = '\x04';
    do {
      cVar5 = cVar2;
      if (uVar4 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00109ead;
      }
      if (uVar4 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00109ead;
      }
      if (uVar4 < 10000) goto LAB_00109ead;
      bVar1 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      cVar2 = cVar5 + '\x04';
    } while (bVar1);
    cVar5 = cVar5 + '\x01';
  }
LAB_00109ead:
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_60,local_58,__val);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->mHeadField,&local_40);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void        setBody(const std::string& body)
            {
                mBody = body;
                addHeadValue("Content-Length", std::to_string(body.size()));
            }